

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Shell::FunctionDefinition::Def_*>::expand(Stack<Shell::FunctionDefinition::Def_*> *this)

{
  Def **__ptr;
  size_t i;
  Def **ppDVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = 8;
  if (this->_capacity != 0) {
    sVar4 = this->_capacity * 2;
  }
  ppDVar1 = (Def **)Lib::alloc(sVar4 * 8);
  sVar3 = this->_capacity;
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    __ptr = this->_stack;
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      ppDVar1[sVar2] = __ptr[sVar2];
    }
    Lib::free(__ptr);
    sVar3 = this->_capacity;
  }
  this->_stack = ppDVar1;
  this->_cursor = ppDVar1 + sVar3;
  this->_end = ppDVar1 + sVar4;
  this->_capacity = sVar4;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }